

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

string * anon_unknown.dwarf_a77ae0::RelativeIfUnder
                   (string *__return_storage_ptr__,string *top,string *in)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  string *extraout_RAX;
  string *psVar3;
  string *local_40 [2];
  _Alloc_hider local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __n = in->_M_string_length;
  if (__n == top->_M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((in->_M_dataplus)._M_p,(top->_M_dataplus)._M_p,__n);
      if (iVar2 != 0) goto LAB_0025e3bc;
    }
    psVar3 = (string *)
             std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x48c7b7);
  }
  else {
LAB_0025e3bc:
    bVar1 = cmsys::SystemTools::IsSubDirectory(in,top);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)in);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
      psVar3 = (string *)&local_30;
      if (local_40[0] != psVar3) {
        operator_delete(local_40[0],(ulong)(local_30._M_p + 1));
        psVar3 = extraout_RAX;
      }
    }
    else {
      psVar3 = (string *)std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  return psVar3;
}

Assistant:

std::string RelativeIfUnder(std::string const& top, std::string const& in)
{
  std::string out;
  if (in == top) {
    out = ".";
  } else if (cmSystemTools::IsSubDirectory(in, top)) {
    out = in.substr(top.size() + 1);
  } else {
    out = in;
  }
  return out;
}